

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void * worker_thread_get_unique_keys(void *arg)

{
  FILE *__stream;
  long lVar1;
  undefined8 uVar2;
  uint local_13c;
  undefined8 uStack_138;
  uint i;
  size_t vsize;
  size_t vbufsize;
  char vbuf [256];
  ulong local_20;
  unsigned_long_long key;
  context *ctx;
  void *arg_local;
  
  vsize = 0x100;
  uStack_138 = 0;
  local_13c = 0;
  key = (unsigned_long_long)arg;
  ctx = (context *)arg;
  while( true ) {
    if (*(uint *)(key + 0x1c) <= local_13c) {
      return (void *)0x0;
    }
    local_20 = (ulong)*(uint *)key << 0x30 | (ulong)local_13c;
    lVar1 = vmemcache_get(*(undefined8 *)(key + 8),&local_20,8,&vbufsize,vsize,0,
                          &stack0xfffffffffffffec8);
    if (lVar1 == -1) break;
    local_13c = local_13c + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x14c,"worker_thread_get_unique_keys");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_get: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void *
worker_thread_get_unique_keys(void *arg)
{
	struct context *ctx = arg;
	unsigned long long key;

	char vbuf[BUF_SIZE];		/* user-provided buffer */
	size_t vbufsize = BUF_SIZE;	/* size of vbuf */
	size_t vsize = 0;		/* real size of the object */

	for (unsigned i = 0; i < ctx->ops_count; i++) {
		key = ((unsigned long long)ctx->thread_number << 48) | i;
		if (vmemcache_get(ctx->cache, &key, sizeof(key),
					vbuf, vbufsize, 0, &vsize) == -1)
			UT_FATAL("ERROR: vmemcache_get: %s",
					vmemcache_errormsg());
	}

	return NULL;
}